

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O3

uint64_t yactfr::internal::anon_unknown_0::readFlUIntBe17At1(uint8_t *buf)

{
  return (ulong)((*buf & 0x7f) * 0x400 + (uint)buf[1] * 4 | (uint)(buf[2] >> 6));
}

Assistant:

std::uint64_t readFlUIntBe17At1(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 8;
    res |= buf[1];
    res <<= 2;
    res |= (buf[2] >> 6);
    res &= UINT64_C(0x1ffff);
    return res;
}